

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HostAddress_p.cpp
# Opt level: O0

bool BamTools::Internal::ParseIp4(string *address,uint32_t *maybeIp4)

{
  int iVar1;
  size_type sVar2;
  reference pvVar3;
  ulong uVar4;
  char *pcVar5;
  int *in_RSI;
  int value;
  size_t j;
  size_t fieldSize;
  string *field;
  uint8_t i;
  uint32_t ipv4;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  addressFields;
  char in_stack_00000167;
  string *in_stack_00000168;
  size_type in_stack_ffffffffffffff78;
  reference in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff90;
  int in_stack_ffffffffffffff94;
  ulong local_68;
  byte local_39;
  int local_38;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_30;
  int *local_18;
  byte local_1;
  
  local_18 = in_RSI;
  Split(in_stack_00000168,in_stack_00000167);
  sVar2 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(&local_30);
  if (sVar2 == 4) {
    local_38 = 0;
    for (local_39 = 0; local_39 < 4; local_39 = local_39 + 1) {
      pvVar3 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::at((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
      uVar4 = std::__cxx11::string::size();
      for (local_68 = 0; local_68 < uVar4; local_68 = local_68 + 1) {
        pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)pvVar3);
        iVar1 = isdigit((int)*pcVar5);
        if (iVar1 == 0) {
          local_1 = 0;
          goto LAB_001d67dd;
        }
      }
      in_stack_ffffffffffffff80 =
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::at((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
      pcVar5 = (char *)std::__cxx11::string::c_str();
      in_stack_ffffffffffffff94 = atoi(pcVar5);
      if ((in_stack_ffffffffffffff94 < 0) || (0xff < in_stack_ffffffffffffff94)) {
        local_1 = 0;
        goto LAB_001d67dd;
      }
      local_38 = in_stack_ffffffffffffff94 + local_38 * 0x100;
    }
    *local_18 = local_38;
    local_1 = 1;
  }
  else {
    local_1 = 0;
  }
LAB_001d67dd:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
  return (bool)(local_1 & 1);
}

Assistant:

static
bool ParseIp4(const string& address, uint32_t& maybeIp4 ) {

    // split IP address into string fields
    vector<string> addressFields = Split(address, '.');
    if ( addressFields.size() != 4 )
        return false;

    // convert each field to integer value
    uint32_t ipv4(0);
    for ( uint8_t i = 0; i < 4; ++i ) {

        const string& field = addressFields.at(i);
        const size_t fieldSize = field.size();
        for ( size_t j = 0; j < fieldSize; ++j ) {
            if ( !isdigit(field[j]) )
                return false;
        }

        int value = atoi( addressFields.at(i).c_str() );
        if ( value < 0 || value > 255 )
            return false;

        // append byte value
        ipv4 <<= 8;
        ipv4 += value;
    }

    // store 32-bit IP address & return success
    maybeIp4 = ipv4;
    return true;
}